

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManIsoStrashReduce2(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  int iVar1;
  Vec_Int_t *__ptr;
  void *__ptr_00;
  Vec_Int_t *in_RAX;
  Vec_Wec_t *vSupps;
  Gia_Man_t *pGVar2;
  long lVar3;
  Vec_Int_t *vCoMap;
  Vec_Int_t *local_38;
  
  local_38 = in_RAX;
  vSupps = Gia_ManCreateCoSupps(p,fVerbose);
  pGVar2 = Gia_ManDupStrashReduce(p,vSupps,&local_38);
  if (local_38->pArray != (int *)0x0) {
    free(local_38->pArray);
  }
  free(local_38);
  iVar1 = vSupps->nCap;
  __ptr = vSupps->pArray;
  if ((long)iVar1 < 1) {
    if (__ptr == (Vec_Int_t *)0x0) goto LAB_00689b61;
  }
  else {
    lVar3 = 0;
    do {
      __ptr_00 = *(void **)((long)&__ptr->pArray + lVar3);
      if (__ptr_00 != (void *)0x0) {
        free(__ptr_00);
        *(undefined8 *)((long)&__ptr->pArray + lVar3) = 0;
      }
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
  }
  free(__ptr);
LAB_00689b61:
  free(vSupps);
  *pvPosEquivs = (Vec_Ptr_t *)0x0;
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_ManIsoStrashReduce2( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    Vec_Int_t * vCoMap;
    Vec_Wec_t * vSupps = Gia_ManCreateCoSupps( p, fVerbose );
    Gia_Man_t * pNew = Gia_ManDupStrashReduce( p, vSupps, &vCoMap );
    Vec_IntFree( vCoMap );
    Vec_WecFree( vSupps );
    *pvPosEquivs = NULL;
    return pNew;
}